

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O0

void __thiscall MultiANN::MultiANN(MultiANN *this,int dim,int k,int *tt,ANNpoint ss)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  ANNpoint pAVar4;
  ANNpointArray ppAVar5;
  long in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  long in_R8;
  int k_1;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar6;
  
  in_RDI[8] = in_EDX;
  in_RDI[1] = in_ESI;
  in_RDI[2] = 0;
  *in_RDI = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)in_RDI[1];
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *(void **)(in_RDI + 10) = pvVar3;
  pAVar4 = annAllocPt((int)((ulong)in_R8 >> 0x20),
                      (ANNcoord)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(ANNpoint *)(in_RDI + 0xc) = pAVar4;
  ppAVar5 = annAllocPts((int)((ulong)in_R8 >> 0x20),(int)in_R8);
  *(ANNpointArray *)(in_RDI + 4) = ppAVar5;
  pvVar3 = operator_new__(8000000);
  *(void **)(in_RDI + 6) = pvVar3;
  for (iVar6 = 0; iVar6 < (int)in_RDI[1]; iVar6 = iVar6 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 10) + (long)iVar6 * 4) =
         *(undefined4 *)(in_RCX + (long)iVar6 * 4);
    *(undefined8 *)(*(long *)(in_RDI + 0xc) + (long)iVar6 * 8) =
         *(undefined8 *)(in_R8 + (long)iVar6 * 8);
  }
  for (iVar6 = 0; iVar6 < 0x1f; iVar6 = iVar6 + 1) {
    *(undefined8 *)(in_RDI + (long)iVar6 * 2 + 0xe) = 0;
  }
  return;
}

Assistant:

MultiANN::MultiANN(  // constructor
    int dim,         // dimension of the space
    int k,           // number of nearest neighbors to be returned
    int *tt,         // topology of the space
    ANNpoint ss)     // scaling of the coordinates
{
    NumNeighbors = k;
    dimension = dim;
    LastNodeCount = 0;
    size = 0;

    topology = new int[dimension];                    // allocate topology array
    scaling = annAllocPt(dimension);                  // allocate scaling array
    points_coor = annAllocPts(MAXPOINTS, dimension);  // allocate data points
    points_ptr = new void *[MAXPOINTS];  // allocate pointers to the data points

    for (int i = 0; i < dimension; i++) {
        topology[i] = tt[i];
        scaling[i] = ss[i];
    }

    for (int k = 0; k < ANN_MAXIMUM_INDEX + 1; k++) {
        AnnArray[k] = NULL;
    }
}